

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_Terminate(void)

{
  undefined4 local_c;
  PaError result;
  
  if (initializationCount_ == 0) {
    local_c = -10000;
  }
  else {
    initializationCount_ = initializationCount_ + -1;
    if (initializationCount_ == 0) {
      CloseOpenStreams();
      TerminateHostApis();
    }
    local_c = 0;
  }
  return local_c;
}

Assistant:

PaError Pa_Terminate( void )
{
    PaError result;

    PA_LOGAPI_ENTER( "Pa_Terminate" );

    if( PA_IS_INITIALISED_ )
    {
        if( --initializationCount_ == 0 )
        {
            CloseOpenStreams();

            TerminateHostApis();

            PaUtil_DumpTraceMessages();
        }
        result = paNoError;
    }
    else
    {
        result=  paNotInitialized;
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_Terminate", result );

    return result;
}